

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

bool __thiscall IMLE::validInverseSolutions(IMLE *this,int *newSol1,int *newSol2,int *worseSol)

{
  double dVar1;
  Scalar *pSVar2;
  reference pFVar3;
  reference piVar4;
  double *scalar;
  StorageBaseType *matrix;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  Scal SVar5;
  Scal SVar6;
  ReturnType RVar7;
  double dVar8;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> PVar9
  ;
  int j_2;
  int j_1;
  Z aux;
  Scal dMax;
  Scal dist;
  Scal dof;
  int k;
  Scal p_value;
  Scal max_p_value;
  int j;
  Vec sumWsq;
  Vec T;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffb28;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffb30;
  Scalar in_stack_fffffffffffffb38;
  reference in_stack_fffffffffffffb40;
  chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  *in_stack_fffffffffffffb48;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  *in_stack_fffffffffffffb50;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  *in_stack_fffffffffffffb58;
  StorageBaseType *in_stack_fffffffffffffb70;
  double *in_stack_fffffffffffffb78;
  int local_244;
  int local_114;
  double local_100;
  int local_9c;
  double local_90;
  int local_88;
  bool local_1;
  
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_fffffffffffffb38);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28)
  ;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_fffffffffffffb38);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28)
  ;
  for (local_88 = 0; local_88 < in_RDI[0x32]; local_88 = local_88 + 1) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffb30,(Index)in_stack_fffffffffffffb28);
    dVar8 = *pSVar2;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xa4),(long)local_88);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffb30,(Index)in_stack_fffffffffffffb28);
    *pSVar2 = *pSVar2 + dVar8;
    pFVar3 = std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
             ::operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0x2c),(long)local_88);
    SVar5 = LinearExpert::get_p_x(&pFVar3->super_LinearExpert);
    pFVar3 = std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
             ::operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0x2c),(long)local_88);
    SVar6 = LinearExpert::get_p_x(&pFVar3->super_LinearExpert);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xa4),(long)local_88);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffb30,(Index)in_stack_fffffffffffffb28);
    *pSVar2 = SVar5 * SVar6 + *pSVar2;
  }
  *in_RCX = -1;
  local_90 = -1.0;
  for (local_9c = 0; local_9c < in_RDI[0xd6]; local_9c = local_9c + 1) {
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator[]((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)(in_RDI + 0xc4),(long)local_9c);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffb40,
               (Index)in_stack_fffffffffffffb38);
    RVar7 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
            dot<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                      (in_stack_fffffffffffffb30,
                       (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                        *)in_stack_fffffffffffffb28);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffb30,(Index)in_stack_fffffffffffffb28);
    *pSVar2 = *pSVar2 - RVar7;
    dVar8 = *(double *)(in_RDI + 0x6e);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffb30,(Index)in_stack_fffffffffffffb28);
    *pSVar2 = *pSVar2 / dVar8;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffb30,(Index)in_stack_fffffffffffffb28);
    dVar8 = *pSVar2;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffb30,(Index)in_stack_fffffffffffffb28);
    dVar1 = *pSVar2;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffb30,(Index)in_stack_fffffffffffffb28);
    if ((1.0 <= ((dVar8 * dVar1) / *pSVar2 - 1.0) * (double)*in_RDI + 1.0) &&
       (pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            in_stack_fffffffffffffb30,(Index)in_stack_fffffffffffffb28),
       0.0 < *pSVar2)) {
      boost::math::
      chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
      ::chi_squared_distribution
                ((chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
                  *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                 in_stack_fffffffffffffb30,(Index)in_stack_fffffffffffffb28);
      dVar8 = boost::math::
              cdf<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                        (in_stack_fffffffffffffb48,(double *)in_stack_fffffffffffffb40);
      if (local_90 <= dVar8) {
        *in_RCX = local_9c;
        local_90 = dVar8;
      }
    }
  }
  if (*(double *)(in_RDI + 0x1e) < local_90) {
    local_100 = -1.0;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb40);
    for (local_114 = 0; local_114 < in_RDI[0x32]; local_114 = local_114 + 1) {
      piVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xa4),(long)local_114);
      if (*piVar4 == *in_RCX) {
        std::
        vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)(in_RDI + 0xaa),(long)local_114);
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)(in_RDI + 0xc4),(long)*in_RCX);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                   in_stack_fffffffffffffb30,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffb28)
        ;
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                  ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffb40
                   ,(Index)in_stack_fffffffffffffb38);
        Eigen::operator*(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>>
        ::operator-(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
        Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                  ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb30,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                    *)in_stack_fffffffffffffb28);
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            in_stack_fffffffffffffb30,(Index)in_stack_fffffffffffffb28);
        dVar8 = *pSVar2;
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)(in_RDI + 0xc4),(long)*in_RCX);
        RVar7 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
                dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                          (in_stack_fffffffffffffb30,
                           (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                           in_stack_fffffffffffffb28);
        if (local_100 < dVar8 + RVar7) {
          *in_RSI = local_114;
          local_100 = dVar8 + RVar7;
        }
      }
    }
    local_100 = -1.0;
    for (local_244 = 0; local_244 < in_RDI[0x32]; local_244 = local_244 + 1) {
      scalar = (double *)
               std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xa4),(long)local_244);
      if (*(int *)scalar == *in_RCX) {
        matrix = (StorageBaseType *)
                 std::
                 vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                 ::operator[]((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                               *)(in_RDI + 0xaa),(long)local_244);
        pFVar3 = std::
                 vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
                 operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                             *)(in_RDI + 0x2c),(long)*in_RSI);
        LinearExpert::getPredZ(&pFVar3->super_LinearExpert);
        PVar9 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                           in_stack_fffffffffffffb30,
                           (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                           in_stack_fffffffffffffb28);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                  ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffb40
                   ,(Index)in_stack_fffffffffffffb38);
        Eigen::operator*(scalar,matrix);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>>
        ::operator-((MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                     *)PVar9.m_lhs,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                     *)PVar9.m_rhs);
        Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                  ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffb30,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                    *)in_stack_fffffffffffffb28);
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            in_stack_fffffffffffffb30,(Index)in_stack_fffffffffffffb28);
        in_stack_fffffffffffffb38 = *pSVar2;
        in_stack_fffffffffffffb40 =
             std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
             ::operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0x2c),(long)*in_RSI);
        in_stack_fffffffffffffb30 =
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             LinearExpert::getPredZ(&in_stack_fffffffffffffb40->super_LinearExpert);
        in_stack_fffffffffffffb28 =
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
                dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                          (in_stack_fffffffffffffb30,
                           (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                           in_stack_fffffffffffffb28);
        if (local_100 < in_stack_fffffffffffffb38 + (double)in_stack_fffffffffffffb28) {
          *in_RDX = local_244;
          local_100 = in_stack_fffffffffffffb38 + (double)in_stack_fffffffffffffb28;
        }
      }
    }
    local_1 = false;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x3000fc);
  }
  else {
    local_1 = true;
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x30010f);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x30011e);
  return local_1;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::validInverseSolutions(int &newSol1, int &newSol2, int &worseSol)
{
    Vec T = Vec::Zero(nInvSolFound);
    Vec sumWsq = Vec::Zero(nInvSolFound);
    for(int j = 0; j < M; j++)
    {
        T(sNearestInv[j]) += zInvRzj(j);
        sumWsq(sNearestInv[j]) += experts[j].get_p_x()*experts[j].get_p_x();
    }

    worseSol = -1;
    Scal max_p_value = -1.0, p_value;
    for(int k = 0; k < nInvSolFound; k++)
    {
        T(k) -= invPredictions[k].dot( sumInvRzj.col(k) );
        T(k) /= (sumAll);

        Scal dof = (sum_p_x(k) * sum_p_x(k) / sumWsq(k) - 1.0) * d;
//        Scal dof = (sum_p_x(k) * sum_p_x(k) / sumWsq(k)) * d;

        // Small hack to prevent numerical problems
        dof += 1.0;
        if( !(dof >= 1.0) || T(k) <= 0.0)  // The negation is because of NaN problems
            continue;
//            dof = 1.0;

        if( ( p_value = cdf(boost::math::chi_squared(dof), T(k)) ) >= max_p_value )
        {
            max_p_value = p_value;
            worseSol = k;
        }
    }

    if( max_p_value <= param.multiValuedSignificance )
        return true;
    else
    {
        // Find the largest expert deviation in worse solution
        Scal dist, dMax = -1.0;
        Z aux;
        for(int j = 0; j < M; j++)
        {
            if (sNearestInv[j] != worseSol)
                continue;

            aux = iInvRj[j] * invPredictions[worseSol] - 2.0 * invRzj.col(j);
            dist = zInvRzj(j) + invPredictions[worseSol].dot( aux );

            if( dist > dMax )
            {
                dMax = dist;
                newSol1 = j;
            }
        }

        // Find the largest expert deviation to newSol1
        dMax = -1.0;
        for(int j = 0; j < M; j++)
        {
            if (sNearestInv[j] != worseSol)
                continue;

            aux = iInvRj[j] * experts[newSol1].getPredZ() - 2.0 * invRzj.col(j);
            dist = zInvRzj(j) + experts[newSol1].getPredZ().dot( aux );

            if( dist > dMax )
            {
                dMax = dist;
                newSol2 = j;
            }
        }

        return false;
    }
}